

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Writer.cpp
# Opt level: O3

void __thiscall OSTEI_VRR_Writer::WriteVRR_External_(OSTEI_VRR_Writer *this,ostream *os,QAM *am)

{
  char *pcVar1;
  OSTEI_VRR_Algorithm_Base *pOVar2;
  pointer pcVar3;
  QAM *pQVar4;
  RRStepType RVar5;
  int iVar6;
  ostream *poVar7;
  _Rb_tree_node_base *p_Var8;
  pointer tam;
  string local_178;
  RRStepType local_154;
  undefined1 local_150 [48];
  OSTEI_VRR_Writer *local_120;
  QAM *local_118;
  QAMList local_110;
  undefined1 local_f8 [16];
  _Alloc_hider local_e8;
  char local_d8 [16];
  undefined1 local_c8 [16];
  _Alloc_hider local_b8;
  char local_a8 [16];
  undefined1 local_98 [16];
  _Alloc_hider local_88;
  char local_78 [16];
  undefined1 local_68 [16];
  _Alloc_hider local_58;
  char local_48 [24];
  
  pOVar2 = this->vrr_algo_;
  local_68._0_4_ = (am->qam)._M_elems[0];
  local_68._4_4_ = (am->qam)._M_elems[1];
  local_68._8_4_ = (am->qam)._M_elems[2];
  local_68._12_4_ = (am->qam)._M_elems[3];
  pcVar3 = (am->tag)._M_dataplus._M_p;
  local_58._M_p = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar3,pcVar3 + (am->tag)._M_string_length);
  RVar5 = OSTEI_VRR_Algorithm_Base::GetRRStep(pOVar2,(QAM *)local_68);
  if (local_58._M_p != local_48) {
    operator_delete(local_58._M_p);
  }
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,indent5_abi_cxx11_._M_dataplus._M_p,indent5_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"VRR_",4);
  RRStepTypeToStr_abi_cxx11_((string *)local_150,RVar5);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(char *)local_150._0_8_,local_150._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_",1);
  local_178._M_dataplus._M_p._0_1_ =
       "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"[(am->qam)._M_elems[0]];
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_178,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_",1);
  local_178._M_dataplus._M_p._0_1_ =
       "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"[(am->qam)._M_elems[1]];
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_178,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_",1);
  local_178._M_dataplus._M_p._0_1_ =
       "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"[(am->qam)._M_elems[2]];
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_178,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"_",1);
  local_178._M_dataplus._M_p._0_1_ =
       "spdfghiklmnoqrtuvwxyzabceSPDFGHIKLMNOQRTUVWXYZABCE0123456789"[(am->qam)._M_elems[3]];
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(poVar7,(char *)&local_178,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(\n",2);
  pcVar1 = local_150 + 0x10;
  if ((char *)local_150._0_8_ != pcVar1) {
    operator_delete((void *)local_150._0_8_);
  }
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,indent7_abi_cxx11_._M_dataplus._M_p,indent7_abi_cxx11_._M_string_length);
  local_150._16_4_ = 0x4d495250;
  local_150._8_8_ = 4;
  local_150[0x14] = '\0';
  local_150._0_8_ = pcVar1;
  ArrVarName(&local_178,am,(string *)local_150);
  if ((char *)local_150._0_8_ != pcVar1) {
    operator_delete((void *)local_150._0_8_);
  }
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(char *)CONCAT71(local_178._M_dataplus._M_p._1_7_,
                                              (char)local_178._M_dataplus._M_p),
                      local_178._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,",\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_178._M_dataplus._M_p._1_7_,(char)local_178._M_dataplus._M_p) !=
      &local_178.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_178._M_dataplus._M_p._1_7_,(char)local_178._M_dataplus._M_p));
  }
  pOVar2 = this->vrr_algo_;
  local_98._0_4_ = (am->qam)._M_elems[0];
  local_98._4_4_ = (am->qam)._M_elems[1];
  local_98._8_4_ = (am->qam)._M_elems[2];
  local_98._12_4_ = (am->qam)._M_elems[3];
  pcVar3 = (am->tag)._M_dataplus._M_p;
  local_88._M_p = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar3,pcVar3 + (am->tag)._M_string_length);
  OSTEI_VRR_Algorithm_Base::GetAMReq(&local_110,pOVar2,(QAM *)local_98);
  local_154 = RVar5;
  local_120 = this;
  local_118 = am;
  if (local_88._M_p != local_78) {
    operator_delete(local_88._M_p);
  }
  if (local_110.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_110.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    tam = local_110.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.super__Vector_impl_data.
          _M_start;
    do {
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,indent7_abi_cxx11_._M_dataplus._M_p,indent7_abi_cxx11_._M_string_length
                         );
      local_150._16_4_ = 0x4d495250;
      local_150._8_8_ = 4;
      local_150[0x14] = '\0';
      local_150._0_8_ = local_150 + 0x10;
      ArrVarName(&local_178,tam,(string *)local_150);
      if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
        operator_delete((void *)local_150._0_8_);
      }
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,(char *)CONCAT71(local_178._M_dataplus._M_p._1_7_,
                                                  (char)local_178._M_dataplus._M_p),
                          local_178._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,",\n",2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT71(local_178._M_dataplus._M_p._1_7_,(char)local_178._M_dataplus._M_p) !=
          &local_178.field_2) {
        operator_delete((undefined1 *)
                        CONCAT71(local_178._M_dataplus._M_p._1_7_,(char)local_178._M_dataplus._M_p))
        ;
      }
      tam = tam + 1;
    } while (tam != local_110.super__Vector_base<QAM,_std::allocator<QAM>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  }
  std::vector<QAM,_std::allocator<QAM>_>::~vector(&local_110);
  pQVar4 = local_118;
  pOVar2 = local_120->vrr_algo_;
  local_c8._0_4_ = (local_118->qam)._M_elems[0];
  local_c8._4_4_ = (local_118->qam)._M_elems[1];
  local_c8._8_4_ = (local_118->qam)._M_elems[2];
  local_c8._12_4_ = (local_118->qam)._M_elems[3];
  pcVar3 = (local_118->tag)._M_dataplus._M_p;
  local_b8._M_p = local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar3,pcVar3 + (local_118->tag)._M_string_length);
  OSTEI_VRR_Algorithm_Base::GetVarReq_abi_cxx11_((StringSet *)local_150,pOVar2,(QAM *)local_c8);
  if (local_b8._M_p != local_a8) {
    operator_delete(local_b8._M_p);
  }
  for (p_Var8 = (_Rb_tree_node_base *)local_150._24_8_;
      p_Var8 != (_Rb_tree_node_base *)(local_150 + 8);
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,indent7_abi_cxx11_._M_dataplus._M_p,indent7_abi_cxx11_._M_string_length);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,*(char **)(p_Var8 + 1),(long)p_Var8[1]._M_parent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,",\n",2);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_150);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,indent7_abi_cxx11_._M_dataplus._M_p,indent7_abi_cxx11_._M_string_length);
  pOVar2 = local_120->vrr_algo_;
  local_f8._0_4_ = (pQVar4->qam)._M_elems[0];
  local_f8._4_4_ = (pQVar4->qam)._M_elems[1];
  local_f8._8_4_ = (pQVar4->qam)._M_elems[2];
  local_f8._12_4_ = (pQVar4->qam)._M_elems[3];
  pcVar3 = (pQVar4->tag)._M_dataplus._M_p;
  local_e8._M_p = local_d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,pcVar3,pcVar3 + (pQVar4->tag)._M_string_length);
  iVar6 = OSTEI_VRR_Algorithm_Base::GetMReq(pOVar2,(QAM *)local_f8);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,iVar6 + 1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,");\n",3);
  RVar5 = local_154;
  if (local_e8._M_p != local_d8) {
    operator_delete(local_e8._M_p);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"SIMINT EXTERNAL VRR ",0x14);
  RRStepTypeToStr_abi_cxx11_((string *)local_150,RVar5);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_150._0_8_,local_150._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,(pQVar4->qam)._M_elems[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,(pQVar4->qam)._M_elems[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,(pQVar4->qam)._M_elems[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,(pQVar4->qam)._M_elems[3]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
  if ((undefined1 *)local_150._0_8_ != local_150 + 0x10) {
    operator_delete((void *)local_150._0_8_);
  }
  return;
}

Assistant:

void OSTEI_VRR_Writer::WriteVRR_External_(std::ostream & os, QAM am) const
{

    // iterate over increasing am
    RRStepType rrstep = vrr_algo_.GetRRStep(am);

    os << indent5 << "VRR_" << RRStepTypeToStr(rrstep) << "_" 
                  << amchar[am[0]] << "_" << amchar[am[1]] << "_"
                  << amchar[am[2]] << "_" << amchar[am[3]]  << "(\n";

    os << indent7 << PrimVarName(am) << ",\n";

    for(const auto & it : vrr_algo_.GetAMReq(am))
        os << indent7 << PrimVarName(it) << ",\n";
    
    for(const auto & it : vrr_algo_.GetVarReq(am))
        os << indent7 << it << ",\n";

    os << indent7 << (vrr_algo_.GetMReq(am)+1) << ");\n";

    // Mark this as required in the log file
    std::cout << "SIMINT EXTERNAL VRR " << RRStepTypeToStr(rrstep)
              << " " << am[0] << " " << am[1] << " " << am[2] << " " << am[3] << "\n";
}